

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnReturnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  bool bVar1;
  Result RVar2;
  Var local_130;
  Enum local_e4;
  Var local_e0;
  Enum local_94;
  undefined1 local_90 [8];
  TableType table_type;
  FuncType func_type;
  Var *table_var_local;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&func_type.field_0x34,CallIndirect);
  this_local._4_4_ = CheckInstr(this,(Opcode)func_type._52_4_,loc);
  FuncType::FuncType((FuncType *)&table_type.limits.has_max);
  TableType::TableType((TableType *)local_90);
  Var::Var(&local_e0,sig_var);
  local_94 = (Enum)CheckFuncTypeIndex(this,&local_e0,(FuncType *)&table_type.limits.has_max);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_94);
  Var::~Var(&local_e0);
  Var::Var(&local_130,table_var);
  local_e4 = (Enum)CheckTableIndex(this,&local_130,(TableType *)local_90);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_e4);
  Var::~Var(&local_130);
  bVar1 = wabt::operator!=((Type)local_90,FuncRef);
  if (bVar1) {
    RVar2 = PrintError(this,loc,
                       "type mismatch: return_call_indirect must reference table of funcref type");
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  RVar2 = TypeChecker::OnReturnCallIndirect
                    (&this->typechecker_,(TypeVector *)&table_type.limits.has_max,
                     (TypeVector *)
                     &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  FuncType::~FuncType((FuncType *)&table_type.limits.has_max);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnReturnCallIndirect(const Location& loc,
                                             Var sig_var,
                                             Var table_var) {
  Result result = CheckInstr(Opcode::CallIndirect, loc);
  FuncType func_type;
  TableType table_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |= CheckTableIndex(table_var, &table_type);
  if (table_type.element != Type::FuncRef) {
    result |= PrintError(loc,
                         "type mismatch: return_call_indirect must reference "
                         "table of funcref type");
  }
  result |=
      typechecker_.OnReturnCallIndirect(func_type.params, func_type.results);
  return result;
}